

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O3

bool __thiscall Vector3::equal(Vector3 *this,Vector3 *rhs,double eps)

{
  double dVar1;
  byte bVar2;
  double dVar3;
  
  dVar3 = this->x - rhs->x;
  dVar1 = -eps;
  bVar2 = 0;
  if ((dVar1 <= dVar3) && (bVar2 = 0, dVar3 <= eps)) {
    dVar3 = this->y - rhs->y;
    bVar2 = 0;
    if ((dVar1 <= dVar3) && (dVar3 <= eps)) {
      dVar3 = this->z - rhs->z;
      bVar2 = -(dVar1 <= dVar3) & -(dVar3 <= eps);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool Vector3::equal(const Vector3 &rhs, double eps) const {
    return !sign(x - rhs.x, eps) &&
           !sign(y - rhs.y, eps) &&
           !sign(z - rhs.z, eps);
}